

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

bool log_series_check(double a)

{
  if (0.0 >= a || a >= 1.0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"LOG_SERIES_CHECK - Warning!\n",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  A <= 0.0 or 1.0 <= A\n",0x17);
  }
  return 0.0 < a && a < 1.0;
}

Assistant:

bool log_series_check ( double a )

//****************************************************************************80
//
//  Purpose:
//
//    LOG_SERIES_CHECK checks the parameter of the Logarithmic Series PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, the parameter of the PDF.
//    0.0 < A < 1.0.
//
//    Output, bool LOG_SERIES_CHECK, is true if the parameters are legal.
//
{
  if ( a <= 0.0 || 1.0 <= a )
  {
    cout << " \n";
    cout << "LOG_SERIES_CHECK - Warning!\n";
    cout << "  A <= 0.0 or 1.0 <= A\n";
    return false;
  }
  return true;
}